

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O3

void __thiscall
cfdcapi_common_CfdEncryptDecryptAES_CBC_Test::TestBody
          (cfdcapi_common_CfdEncryptDecryptAES_CBC_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  int ret;
  char *output;
  AssertionResult gtest_ar;
  void *handle;
  AssertHelper local_58;
  AssertHelper local_50;
  int local_44;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  void *local_10;
  
  local_10 = (void *)0x0;
  local_44 = CfdCreateHandle(&local_10);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_40.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_30,"kCfdSuccess","ret",(CfdErrorCode *)&local_40,&local_44);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_40);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x20f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.ptr_._0_1_ = local_10 != (void *)0x0;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_10 == (void *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_40,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x210,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                       (char)local_30._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p));
    }
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_44 = CfdEncryptAES(local_10,
                           "616975656F616975656F616975656F616975656F616975656F616975656F6169",
                           "33343536373839303132333435363738",
                           "74657374207465737420746573742074657374",(char **)&local_40);
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_30,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_44);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x21a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_44 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_30,"exp_aes","output",
               "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22",
               (char *)local_40.ptr_);
    if ((char)local_30._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_30._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x21c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_30._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_40.ptr_);
    local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_44 = CfdDecryptAES(local_10,
                           "616975656F616975656F616975656F616975656F616975656F616975656F6169",
                           "33343536373839303132333435363738",
                           "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22",
                           (char **)&local_40);
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_30,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_44);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x226,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_44 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_30,"target_data","output","74657374207465737420746573742074657374"
               ,(char *)local_40.ptr_);
    if ((char)local_30._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_30._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x228,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_30._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_40.ptr_);
    local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_44 = CfdFreeHandle(local_10);
  local_58.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_30,"kCfdSuccess","ret",(CfdErrorCode *)&local_58,&local_44);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdEncryptDecryptAES_CBC) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* target_data = "74657374207465737420746573742074657374";
  const char* exp_aes = "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22";
  ret = CfdEncryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "33343536373839303132333435363738",
      target_data,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp_aes, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdDecryptAES(handle,
      "616975656F616975656F616975656F616975656F616975656F616975656F6169",
      "33343536373839303132333435363738",
      exp_aes,
      &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(target_data, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}